

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tag_alias_registry.hpp
# Opt level: O2

void __thiscall
Catch::TagAliasRegistry::add(TagAliasRegistry *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  bool bVar1;
  ostream *poVar2;
  domain_error *pdVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_bool>
  pVar4;
  allocator local_284;
  allocator local_283;
  allocator local_282;
  allocator local_281;
  string local_280;
  Option<Catch::TagAlias> local_260;
  string local_210;
  string local_1f0;
  SourceLineInfo local_1d0;
  ostringstream oss;
  TagAlias local_1a0 [5];
  
  std::__cxx11::string::string((string *)&oss,alias,&local_281);
  std::__cxx11::string::string((string *)&local_260,"[@",&local_282);
  bVar1 = startsWith((string *)&oss,(string *)&local_260);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_280,alias,&local_283);
    std::__cxx11::string::string((string *)&local_210,"]",&local_284);
    bVar1 = endsWith(&local_280,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&oss);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_1f0,tag,(allocator *)&local_280);
      SourceLineInfo::SourceLineInfo(&local_1d0,lineInfo);
      TagAlias::TagAlias((TagAlias *)&local_260,&local_1f0,&local_1d0);
      _oss = alias;
      TagAlias::TagAlias(local_1a0,(TagAlias *)&local_260);
      pVar4 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
              ::_M_emplace_unique<std::pair<char_const*,Catch::TagAlias>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
                          *)&this->m_registry,(pair<const_char_*,_Catch::TagAlias> *)&oss);
      TagAlias::~TagAlias(local_1a0);
      TagAlias::~TagAlias((TagAlias *)&local_260);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"error: tag alias, \"");
      poVar2 = std::operator<<(poVar2,alias);
      poVar2 = std::operator<<(poVar2,"\" already registered.\n");
      poVar2 = std::operator<<(poVar2,"\tFirst seen at ");
      std::__cxx11::string::string((string *)&local_280,alias,(allocator *)&local_210);
      (*(this->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])(&local_260,this,&local_280);
      operator<<(poVar2,&(local_260.nullableValue)->lineInfo);
      poVar2 = std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<(poVar2,"\tRedefined at ");
      operator<<(poVar2,lineInfo);
      Option<Catch::TagAlias>::reset(&local_260);
      std::__cxx11::string::~string((string *)&local_280);
      pdVar3 = (domain_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::domain_error::domain_error(pdVar3,(char *)local_260.nullableValue);
      __cxa_throw(pdVar3,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
  }
  else {
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&oss);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"error: tag alias, \"");
  poVar2 = std::operator<<(poVar2,alias);
  poVar2 = std::operator<<(poVar2,"\" is not of the form [@alias name].\n");
  operator<<(poVar2,lineInfo);
  pdVar3 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(pdVar3,(char *)local_260.nullableValue);
  __cxa_throw(pdVar3,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void TagAliasRegistry::add( char const* alias, char const* tag, SourceLineInfo const& lineInfo ) {

        if( !startsWith( alias, "[@" ) || !endsWith( alias, "]" ) ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" is not of the form [@alias name].\n" << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
        if( !m_registry.insert( std::make_pair( alias, TagAlias( tag, lineInfo ) ) ).second ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" already registered.\n"
                << "\tFirst seen at " << find(alias)->lineInfo << "\n"
                << "\tRedefined at " << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
    }